

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_widget_at.cpp
# Opt level: O2

bool anon_unknown.dwarf_1b2b19::has_coordinates(Widget *w,size_t global_x,size_t global_y)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  
  if (w->enabled_ == true) {
    sVar2 = cppurses::Widget::inner_x(w);
    sVar3 = cppurses::Widget::inner_x(w);
    sVar4 = cppurses::Widget::width(w);
    sVar5 = cppurses::Widget::inner_y(w);
    sVar6 = cppurses::Widget::inner_y(w);
    sVar7 = cppurses::Widget::height(w);
    bVar1 = false;
    if ((sVar2 <= global_x) && (bVar1 = false, global_x < sVar4 + sVar3)) {
      bVar1 = sVar5 <= global_y && global_y < sVar7 + sVar6;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool has_coordinates(const cppurses::Widget& w,
                     std::size_t global_x,
                     std::size_t global_y) {
    if (!w.enabled()) {
        return false;
    }
    const bool within_west = global_x >= w.inner_x();
    const bool within_east = global_x < (w.inner_x() + w.width());
    const bool within_north = global_y >= w.inner_y();
    const bool within_south = global_y < (w.inner_y() + w.height());
    return within_west && within_east && within_north && within_south;
}